

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O2

KFLOAT64 __thiscall
KDIS::DATA_TYPE::WorldCoordinates::GetDistance(WorldCoordinates *this,WorldCoordinates *Other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  WorldCoordinates tmp;
  DataTypeBase local_20;
  double local_18;
  double dStack_10;
  double local_8;
  
  local_20._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00216ae8;
  local_18 = (double)this->m_f64X - (double)Other->m_f64X;
  dStack_10 = (double)this->m_f64Y - (double)Other->m_f64Y;
  local_8 = (double)this->m_f64Z - (double)Other->m_f64Z;
  dVar3 = dStack_10 * dStack_10;
  dVar2 = local_18 * local_18;
  dVar1 = local_8 * local_8;
  DataTypeBase::~DataTypeBase(&local_20);
  return (KFLOAT64)SQRT(dVar1 + dVar2 + dVar3);
}

Assistant:

KFLOAT64 WorldCoordinates::GetDistance( const WorldCoordinates & Other )
{
    WorldCoordinates w = *this - Other;
    KFLOAT64 f = ( w.m_f64X * w.m_f64X ) + ( w.m_f64Y * w.m_f64Y ) + ( w.m_f64Z * w.m_f64Z );
    return sqrt( f );
}